

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

RK_S32 mpp_av1_tile_info(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_U8 RVar1;
  undefined4 uVar2;
  uint uVar3;
  uint6 uVar4;
  RK_S32 RVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  RK_S32 k;
  RK_U32 RVar11;
  byte bVar12;
  RK_S32 k_1;
  int iVar13;
  int iVar14;
  BitReadCtx_t *pBVar15;
  uint uVar16;
  RK_U32 RVar17;
  RK_U32 range_max;
  ulong uVar18;
  RK_U32 RVar19;
  int iVar20;
  AV1RawFrameHeader *pAVar21;
  bool bVar22;
  RK_U32 value;
  uint local_64;
  ulong local_60;
  BitReadCtx_t *local_58;
  AV1RawFrameHeader *local_50;
  RK_U32 local_44;
  ulong local_40;
  AV1Context *local_38;
  
  uVar16 = ctx->frame_width + 7 >> 2 & 0xfffffffe;
  uVar9 = ctx->frame_height + 7 >> 2 & 0xfffffffe;
  RVar1 = ctx->sequence_header->use_128x128_superblock;
  uVar7 = (int)(uVar16 + 0xf) >> 4;
  if (RVar1 != '\0') {
    uVar7 = (int)(uVar16 + 0x1f) >> 5;
  }
  local_60 = (ulong)uVar7;
  bVar12 = RVar1 == '\0' ^ 7;
  uVar16 = 0x1000 >> bVar12;
  RVar11 = 0xffffffff;
  do {
    RVar11 = RVar11 + 1;
  } while ((int)(uVar16 << ((byte)RVar11 & 0x1f)) < (int)uVar7);
  uVar3 = (int)(uVar9 + 0x1f) >> 5;
  if (RVar1 == '\0') {
    uVar3 = (int)(uVar9 + 0xf) >> 4;
  }
  local_40 = (ulong)uVar3;
  uVar9 = 0x40;
  if ((int)uVar7 < 0x40) {
    uVar9 = uVar7;
  }
  RVar19 = 0xffffffff;
  do {
    RVar19 = RVar19 + 1;
  } while (1 << ((byte)RVar19 & 0x1f) < (int)uVar9);
  uVar9 = 0x40;
  if ((int)uVar3 < 0x40) {
    uVar9 = uVar3;
  }
  range_max = 0xffffffff;
  do {
    range_max = range_max + 1;
  } while (1 << ((byte)range_max & 0x1f) < (int)uVar9);
  uVar9 = 0x900000 >> bVar12 * '\x02';
  iVar13 = uVar3 * uVar7;
  uVar7 = 0xffffffff;
  do {
    uVar7 = uVar7 + 1;
  } while ((int)(uVar9 << ((byte)uVar7 & 0x1f)) < iVar13);
  RVar17 = RVar11;
  if (RVar11 <= uVar7) {
    RVar17 = 0xffffffff;
    do {
      RVar17 = RVar17 + 1;
    } while ((int)(uVar9 << ((byte)RVar17 & 0x1f)) < iVar13);
  }
  local_58 = gb;
  local_50 = current;
  local_38 = ctx;
  RVar5 = mpp_av1_read_unsigned(gb,1,"uniform_tile_spacing_flag",&local_64,0,1);
  pBVar15 = local_58;
  if (RVar5 < 0) {
    return RVar5;
  }
  local_50->uniform_tile_spacing_flag = (byte)local_64;
  if ((byte)local_64 == '\0') {
    bVar12 = 0;
    uVar8 = 0;
    uVar7 = 0;
    iVar14 = (int)local_60;
    if (0 < iVar14) {
      uVar8 = 0;
      iVar20 = 0;
      uVar7 = 0;
      local_44 = uVar16;
      do {
        RVar11 = iVar14 - iVar20;
        if ((int)local_44 <= iVar14 - iVar20) {
          RVar11 = local_44;
        }
        local_60 = uVar8;
        RVar5 = mpp_av1_read_ns(local_58,"width_in_sbs_minus_1[i]",RVar11,&local_64);
        if (RVar5 < 0) {
          return RVar5;
        }
        uVar9 = (local_64 & 0xff) + 1;
        if (uVar7 < uVar9) {
          uVar7 = uVar9;
        }
        local_50->width_in_sbs_minus_1[local_60] = (RK_U8)local_64;
        iVar20 = iVar20 + (local_64 & 0xff) + 1;
        uVar8 = local_60 + 1;
        pBVar15 = local_58;
      } while ((iVar20 < iVar14) && (local_60 < 0x3f));
    }
    do {
      bVar10 = bVar12;
      bVar12 = bVar10 + 1;
    } while (1 << (bVar10 & 0x1f) < (int)uVar8);
    local_50->tile_cols_log2 = bVar10;
    local_50->tile_cols = (RK_U16)uVar8;
    bVar12 = (char)RVar17 + 1;
    if (RVar17 == 0) {
      bVar12 = 0;
    }
    RVar11 = (iVar13 >> (bVar12 & 0x1f)) / (int)uVar7;
    if ((int)RVar11 < 2) {
      RVar11 = 1;
    }
    iVar13 = 0 >> (bVar12 & 0x1f);
    uVar8 = 0;
    iVar14 = (int)local_40;
    pAVar21 = local_50;
    if (0 < iVar14) {
      iVar20 = 0;
      uVar18 = 0;
      do {
        RVar19 = iVar14 - iVar20;
        if ((int)RVar11 <= iVar14 - iVar20) {
          RVar19 = RVar11;
        }
        RVar5 = mpp_av1_read_ns(pBVar15,"height_in_sbs_minus_1[i]",RVar19,&local_64);
        if (RVar5 < 0) {
          return -1;
        }
        local_50->height_in_sbs_minus_1[uVar18] = (RK_U8)local_64;
        iVar20 = iVar20 + (local_64 & 0xff) + 1;
        uVar8 = uVar18 + 1;
        pBVar15 = local_58;
        pAVar21 = local_50;
      } while ((iVar20 < iVar14) && (bVar22 = uVar18 < 0x3f, uVar18 = uVar8, bVar22));
    }
    do {
      bVar12 = (byte)iVar13;
      iVar13 = iVar13 + 1;
    } while (1 << (bVar12 & 0x1f) < (int)uVar8);
    bVar12 = (char)iVar13 - 1;
    pAVar21->tile_rows_log2 = bVar12;
    pAVar21->tile_rows = (RK_U16)uVar8;
  }
  else {
    RVar5 = mpp_av1_read_increment(local_58,RVar11,RVar19,"tile_cols_log2",&local_64);
    pAVar21 = local_50;
    if (RVar5 < 0) {
      return RVar5;
    }
    bVar12 = (byte)local_64;
    local_50->tile_cols_log2 = bVar12;
    iVar13 = (int)local_60 + (1 << (bVar12 & 0x1f)) + -1 >> (bVar12 & 0x1f);
    local_50->tile_cols = (RK_U16)(((int)local_60 + iVar13 + -1) / iVar13);
    RVar17 = RVar17 - (local_64 & 0xff);
    RVar11 = 0;
    if (0 < (int)RVar17) {
      RVar11 = RVar17;
    }
    RVar5 = mpp_av1_read_increment(pBVar15,RVar11,range_max,"tile_rows_log2",&local_64);
    if (RVar5 < 0) {
      return -1;
    }
    pAVar21->tile_rows_log2 = (byte)local_64;
    iVar14 = (int)local_40 + (1 << ((byte)local_64 & 0x1f)) + -1 >> ((byte)local_64 & 0x1f);
    pAVar21->tile_rows = (RK_U16)(((int)local_40 + iVar14 + -1) / iVar14);
    if (pAVar21->tile_cols < 2) {
      uVar8 = (ulong)(pAVar21->tile_cols - 1);
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      do {
        pAVar21->width_in_sbs_minus_1[lVar6] = (char)iVar13 + 0xff;
        lVar6 = lVar6 + 1;
        uVar8 = (ulong)pAVar21->tile_cols - 1;
      } while (lVar6 < (long)uVar8);
    }
    pAVar21->width_in_sbs_minus_1[lVar6] = (char)local_60 + ~((char)uVar8 * (char)iVar13);
    if (pAVar21->tile_rows < 2) {
      uVar8 = (ulong)(pAVar21->tile_rows - 1);
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      do {
        pAVar21->height_in_sbs_minus_1[lVar6] = (char)iVar14 + 0xff;
        lVar6 = lVar6 + 1;
        uVar8 = (ulong)pAVar21->tile_rows - 1;
      } while (lVar6 < (long)uVar8);
    }
    pAVar21->height_in_sbs_minus_1[lVar6] = (char)local_40 + ~((char)uVar8 * (char)iVar14);
    pBVar15 = local_58;
    bVar12 = (byte)local_64;
  }
  if (pAVar21->tile_cols_log2 == 0 && bVar12 == 0) {
    pAVar21->context_update_tile_id = 0;
    pAVar21->tile_size_bytes_minus1 = '\x03';
LAB_001c330d:
    uVar2._0_2_ = pAVar21->tile_cols;
    uVar2._2_2_ = pAVar21->tile_rows;
    uVar4 = CONCAT24(uVar2._2_2_,uVar2);
    local_38->tile_cols = (int)(ulong)(uVar4 & 0xffff0000ffff);
    local_38->tile_rows = (int)((ulong)(uVar4 & 0xffff0000ffff) >> 0x20);
    return 0;
  }
  iVar13 = (uint)bVar12 + (uint)pAVar21->tile_cols_log2;
  RVar5 = mpp_av1_read_unsigned
                    (pBVar15,iVar13,"context_update_tile_id",&local_64,0,
                     ~(uint)(-1L << ((byte)iVar13 & 0x3f)));
  if (-1 < RVar5) {
    pAVar21->context_update_tile_id = (RK_U16)local_64;
    RVar5 = mpp_av1_read_unsigned(pBVar15,2,"tile_size_bytes_minus1",&local_64,0,3);
    if (-1 < RVar5) {
      pAVar21->tile_size_bytes_minus1 = (byte)local_64;
      goto LAB_001c330d;
    }
  }
  return -1;
}

Assistant:

static RK_S32 mpp_av1_tile_info(AV1Context *ctx, BitReadCtx_t *gb,
                                AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 mi_cols, mi_rows, sb_cols, sb_rows, sb_shift, sb_size;
    RK_S32 max_tile_width_sb, max_tile_height_sb, max_tile_area_sb;
    RK_S32 min_log2_tile_cols, max_log2_tile_cols, max_log2_tile_rows;
    RK_S32 min_log2_tiles, min_log2_tile_rows;
    RK_S32 i, err;

    mi_cols = 2 * ((ctx->frame_width  + 7) >> 3);
    mi_rows = 2 * ((ctx->frame_height + 7) >> 3);

    sb_cols = seq->use_128x128_superblock ? ((mi_cols + 31) >> 5)
              : ((mi_cols + 15) >> 4);
    sb_rows = seq->use_128x128_superblock ? ((mi_rows + 31) >> 5)
              : ((mi_rows + 15) >> 4);

    sb_shift = seq->use_128x128_superblock ? 5 : 4;
    sb_size  = sb_shift + 2;

    max_tile_width_sb = AV1_MAX_TILE_WIDTH >> sb_size;
    max_tile_area_sb  = AV1_MAX_TILE_AREA  >> (2 * sb_size);

    min_log2_tile_cols = mpp_av1_tile_log2(max_tile_width_sb, sb_cols);
    max_log2_tile_cols = mpp_av1_tile_log2(1, MPP_MIN(sb_cols, AV1_MAX_TILE_COLS));
    max_log2_tile_rows = mpp_av1_tile_log2(1, MPP_MIN(sb_rows, AV1_MAX_TILE_ROWS));
    min_log2_tiles = MPP_MAX(min_log2_tile_cols,
                             mpp_av1_tile_log2(max_tile_area_sb, sb_rows * sb_cols));

    flag(uniform_tile_spacing_flag);

    if (current->uniform_tile_spacing_flag) {
        RK_S32 tile_width_sb, tile_height_sb;

        increment(tile_cols_log2, min_log2_tile_cols, max_log2_tile_cols);

        tile_width_sb = (sb_cols + (1 << current->tile_cols_log2) - 1) >>
                        current->tile_cols_log2;
        current->tile_cols = (sb_cols + tile_width_sb - 1) / tile_width_sb;

        min_log2_tile_rows = MPP_MAX(min_log2_tiles - current->tile_cols_log2, 0);

        increment(tile_rows_log2, min_log2_tile_rows, max_log2_tile_rows);

        tile_height_sb = (sb_rows + (1 << current->tile_rows_log2) - 1) >>
                         current->tile_rows_log2;
        current->tile_rows = (sb_rows + tile_height_sb - 1) / tile_height_sb;

        for (i = 0; i < current->tile_cols - 1; i++)
            infer(width_in_sbs_minus_1[i], tile_width_sb - 1);
        infer(width_in_sbs_minus_1[i],
              sb_cols - (current->tile_cols - 1) * tile_width_sb - 1);
        for (i = 0; i < current->tile_rows - 1; i++)
            infer(height_in_sbs_minus_1[i], tile_height_sb - 1);
        infer(height_in_sbs_minus_1[i],
              sb_rows - (current->tile_rows - 1) * tile_height_sb - 1);

    } else {
        RK_S32 widest_tile_sb, start_sb, size_sb, max_width, max_height;

        widest_tile_sb = 0;

        start_sb = 0;
        for (i = 0; start_sb < sb_cols && i < AV1_MAX_TILE_COLS; i++) {
            max_width = MPP_MIN(sb_cols - start_sb, max_tile_width_sb);
            ns(max_width, width_in_sbs_minus_1[i]);
            //ns(max_width, width_in_sbs_minus_1[i]);
            size_sb = current->width_in_sbs_minus_1[i] + 1;
            widest_tile_sb = MPP_MAX(size_sb, widest_tile_sb);
            start_sb += size_sb;
        }
        current->tile_cols_log2 = mpp_av1_tile_log2(1, i);
        current->tile_cols = i;

        if (min_log2_tiles > 0)
            max_tile_area_sb = (sb_rows * sb_cols) >> (min_log2_tiles + 1);
        else
            max_tile_area_sb = sb_rows * sb_cols;
        max_tile_height_sb = MPP_MAX(max_tile_area_sb / widest_tile_sb, 1);

        start_sb = 0;
        for (i = 0; start_sb < sb_rows && i < AV1_MAX_TILE_ROWS; i++) {
            max_height = MPP_MIN(sb_rows - start_sb, max_tile_height_sb);
            ns(max_height, height_in_sbs_minus_1[i]);
            size_sb = current->height_in_sbs_minus_1[i] + 1;
            start_sb += size_sb;
        }
        current->tile_rows_log2 = mpp_av1_tile_log2(1, i);
        current->tile_rows = i;
    }

    if (current->tile_cols_log2 > 0 ||
        current->tile_rows_log2 > 0) {
        fb(current->tile_cols_log2 + current->tile_rows_log2,
           context_update_tile_id);
        fb(2, tile_size_bytes_minus1);
    } else {
        infer(context_update_tile_id, 0);
        current->tile_size_bytes_minus1 = 3;
    }

    ctx->tile_cols = current->tile_cols;
    ctx->tile_rows = current->tile_rows;

    return 0;
}